

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O3

void duckdb::MatchAndReplaceUserSetVariables
               (DialectOptions *original,DialectOptions *sniffed,string *error,bool found_date,
               bool found_timestamp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  undefined3 in_register_00000081;
  key_type local_5a [2];
  string local_58;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000081,found_timestamp);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Header","");
  MatchAndReplace<bool>(&original->header,&sniffed->header,&local_58,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((sniffed->state_machine_options).new_line.value != NOT_SET) {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"New Line","");
    MatchAndReplace<duckdb::NewLineIdentifier>
              (&(original->state_machine_options).new_line,
               &(sniffed->state_machine_options).new_line,&local_58,error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Skip Rows","");
  MatchAndReplace<unsigned_long>(&original->skip_rows,&sniffed->skip_rows,&local_58,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Delimiter","");
  MatchAndReplace<std::__cxx11::string>
            ((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)original,
             (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)sniffed,&local_58,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Quote","");
  MatchAndReplace<char>
            (&(original->state_machine_options).quote,&(sniffed->state_machine_options).quote,
             &local_58,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Escape","");
  MatchAndReplace<char>
            (&(original->state_machine_options).escape,&(sniffed->state_machine_options).escape,
             &local_58,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Comment","");
  MatchAndReplace<char>
            (&(original->state_machine_options).comment,&(sniffed->state_machine_options).comment,
             &local_58,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (found_date) {
    local_5a[1] = 0xf;
    pmVar2 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](&original->date_format,local_5a + 1);
    local_5a[0] = DATE;
    pmVar3 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](&sniffed->date_format,local_5a);
    local_58._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Date Format","");
    MatchAndReplace<duckdb::StrpTimeFormat>(pmVar2,pmVar3,&local_58,error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  if ((char)local_34 != '\0') {
    local_5a[1] = 0x13;
    pmVar2 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](&original->date_format,local_5a + 1);
    local_5a[0] = TIMESTAMP;
    pmVar3 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](&sniffed->date_format,local_5a);
    local_58._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Timestamp Format","");
    MatchAndReplace<duckdb::StrpTimeFormat>(pmVar2,pmVar3,&local_58,error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void MatchAndReplaceUserSetVariables(DialectOptions &original, DialectOptions &sniffed, string &error, bool found_date,
                                     bool found_timestamp) {
	MatchAndReplace(original.header, sniffed.header, "Header", error);
	if (sniffed.state_machine_options.new_line.GetValue() != NewLineIdentifier::NOT_SET) {
		// Is sniffed line is not set (e.g., single-line file) , we don't try to replace and match.
		MatchAndReplace(original.state_machine_options.new_line, sniffed.state_machine_options.new_line, "New Line",
		                error);
	}
	MatchAndReplace(original.skip_rows, sniffed.skip_rows, "Skip Rows", error);
	MatchAndReplace(original.state_machine_options.delimiter, sniffed.state_machine_options.delimiter, "Delimiter",
	                error);
	MatchAndReplace(original.state_machine_options.quote, sniffed.state_machine_options.quote, "Quote", error);
	MatchAndReplace(original.state_machine_options.escape, sniffed.state_machine_options.escape, "Escape", error);
	MatchAndReplace(original.state_machine_options.comment, sniffed.state_machine_options.comment, "Comment", error);
	if (found_date) {
		MatchAndReplace(original.date_format[LogicalTypeId::DATE], sniffed.date_format[LogicalTypeId::DATE],
		                "Date Format", error);
	}
	if (found_timestamp) {
		MatchAndReplace(original.date_format[LogicalTypeId::TIMESTAMP], sniffed.date_format[LogicalTypeId::TIMESTAMP],
		                "Timestamp Format", error);
	}
}